

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void NV12ToRGB565Row_C(uint8_t *src_y,uint8_t *src_uv,uint8_t *dst_rgb565,YuvConstants *yuvconstants
                      ,int width)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int br;
  int bg;
  int bb;
  
  if (1 < width) {
    sVar1 = yuvconstants->kUVBiasB[0];
    sVar2 = yuvconstants->kUVBiasG[0];
    sVar3 = yuvconstants->kUVBiasR[0];
    iVar4 = yuvconstants->kYToRgb[0] * 0x101;
    iVar13 = 0;
    do {
      uVar11 = (uint)*src_y * iVar4 >> 0x10;
      iVar14 = (int)sVar1 - (int)yuvconstants->kUVToB[0] * (uint)*src_uv;
      uVar12 = (int)(iVar14 + uVar11) >> 6;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      if (0xfe < (int)uVar12) {
        uVar12 = 0xff;
      }
      iVar5 = (int)sVar2 -
              ((int)yuvconstants->kUVToG[1] * (uint)src_uv[1] +
              (int)yuvconstants->kUVToG[0] * (uint)*src_uv);
      iVar10 = iVar5 + uVar11;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      uVar8 = iVar10 >> 6;
      if (0xfe < (int)uVar8) {
        uVar8 = 0xff;
      }
      iVar10 = (int)sVar3 - (int)yuvconstants->kUVToR[1] * (uint)src_uv[1];
      uVar11 = (int)(uVar11 + iVar10) >> 6;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if (0xfe < (int)uVar11) {
        uVar11 = 0xff;
      }
      uVar9 = (uint)src_y[1] * iVar4 >> 0x10;
      uVar15 = (int)(iVar14 + uVar9) >> 6;
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      if (0xfe < (int)uVar15) {
        uVar15 = 0xff;
      }
      iVar5 = iVar5 + uVar9;
      if (iVar5 >> 6 < 1) {
        iVar5 = 0;
      }
      uVar6 = iVar5 >> 6;
      if (0xfe < (int)uVar6) {
        uVar6 = 0xff;
      }
      uVar9 = (int)(uVar9 + iVar10) >> 6;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      if (0xfe < (int)uVar9) {
        uVar9 = 0xff;
      }
      *(uint *)dst_rgb565 =
           (uVar9 & 0xfffffff8) << 0x18 | (uVar6 & 0xfc) << 0x13 |
           (uVar15 & 0xf8) << 0xd | (uVar11 & 0xf8) << 8 | (uVar12 >> 3) + (uVar8 & 0xfc) * 8;
      src_y = src_y + 2;
      src_uv = src_uv + 2;
      dst_rgb565 = (uint8_t *)((long)dst_rgb565 + 4);
      iVar13 = iVar13 + 2;
    } while (iVar13 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar11 = (int)yuvconstants->kYToRgb[0] * (uint)*src_y * 0x101 >> 0x10;
    uVar12 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)*src_uv) +
                  uVar11) >> 6;
    uVar8 = 0;
    if ((int)uVar12 < 1) {
      uVar12 = uVar8;
    }
    uVar7 = (ushort)uVar12;
    if (0xfe < (int)uVar12) {
      uVar7 = 0xff;
    }
    uVar12 = (int)(((int)yuvconstants->kUVBiasG[0] -
                   ((int)yuvconstants->kUVToG[1] * (uint)src_uv[1] +
                   (int)yuvconstants->kUVToG[0] * (uint)*src_uv)) + uVar11) >> 6;
    if ((int)uVar12 < 1) {
      uVar12 = uVar8;
    }
    if (0xfe < (int)uVar12) {
      uVar12 = 0xff;
    }
    uVar11 = (int)(((int)yuvconstants->kUVBiasR[0] - (int)yuvconstants->kUVToR[1] * (uint)src_uv[1])
                  + uVar11) >> 6;
    if ((int)uVar11 < 1) {
      uVar11 = uVar8;
    }
    if (0xfe < (int)uVar11) {
      uVar11 = 0xff;
    }
    *(ushort *)dst_rgb565 =
         (ushort)((uVar11 & 0xfffffff8) << 8) | (ushort)((uVar12 & 0xfc) << 3) | uVar7 >> 3;
  }
  return;
}

Assistant:

void NV12ToRGB565Row_C(const uint8_t* src_y,
                       const uint8_t* src_uv,
                       uint8_t* dst_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_uv[0], src_uv[1], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_uv[0], src_uv[1], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    b1 = b1 >> 3;
    g1 = g1 >> 2;
    r1 = r1 >> 3;
    *(uint32_t*)(dst_rgb565) =
        b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) | (r1 << 27);
    src_y += 2;
    src_uv += 2;
    dst_rgb565 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_uv[0], src_uv[1], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    *(uint16_t*)(dst_rgb565) = b0 | (g0 << 5) | (r0 << 11);
  }
}